

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableWriterFields
          (SwiftGenerator *this,FieldDef *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_body,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_header)

{
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  byte local_b79;
  bool local_b6a;
  bool local_a9a;
  bool local_a51;
  allocator<char> local_a39;
  string local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  allocator<char> local_991;
  string local_990;
  string local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  undefined1 local_910 [8];
  string field_name;
  Type vectortype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  char *local_870;
  char *reader_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  string local_7c8;
  undefined1 local_7a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  char *local_6c8;
  char *create_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  undefined1 local_510 [8];
  string default_value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  byte local_422;
  allocator<char> local_421;
  undefined1 local_420 [8];
  string default_value;
  string local_3f8;
  byte local_3d2;
  byte local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  byte local_36a;
  allocator<char> local_369;
  undefined1 local_368 [8];
  string optional_enum;
  undefined1 local_340 [8];
  string is_enum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> body;
  undefined1 local_218 [8];
  string check_if_vector;
  allocator<char> local_1d1;
  string local_1d0;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  string local_140;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  string nullable_type;
  undefined1 local_d0 [7];
  bool opt_scalar;
  string type;
  string field_var;
  string field_field;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *create_func_header;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *create_func_body;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string builder_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *create_header_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *create_body_local;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  builder_string.field_2._8_8_ = create_header;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,", _ fbb: inout FlatBufferBuilder) { ",&local_49);
  std::allocator<char>::~allocator(&local_49);
  this_00 = builder_string.field_2._8_8_;
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_var.field_2 + 8),&this->namer_,field);
  IdlNamer::Variable_abi_cxx11_((string *)((long)&type.field_2 + 8),&this->namer_,field);
  GenType_abi_cxx11_((string *)local_d0,this,&(field->value).type,false);
  bVar1 = FieldDef::IsOptional(field);
  local_a51 = false;
  if (bVar1) {
    local_a51 = IsScalar((field->value).type.base_type);
  }
  nullable_type.field_2._M_local_buf[0xf] = local_a51;
  if (local_a51 == false) {
    std::__cxx11::string::string((string *)local_f8,(string *)local_d0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,"?"
                  );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"FIELDVAR",&local_119);
  IdlNamer::Variable_abi_cxx11_(&local_140,&this->namer_,field);
  CodeWriter::SetValue(&this->code_,&local_118,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"VALUETYPE",&local_161);
  CodeWriter::SetValue(&this->code_,&local_160,(string *)local_f8);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"OFFSET",&local_189);
  IdlNamer::Field_abi_cxx11_(&local_1b0,&this->namer_,field);
  CodeWriter::SetValue(&this->code_,&local_188,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"CONSTANT",&local_1d1);
  SwiftConstant_abi_cxx11_((string *)((long)&check_if_vector.field_2 + 8),this,field);
  CodeWriter::SetValue(&this->code_,&local_1d0,(string *)((long)&check_if_vector.field_2 + 8));
  std::__cxx11::string::~string((string *)(check_if_vector.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  bVar1 = IsVector(&(field->value).type);
  local_a9a = true;
  if (!bVar1) {
    local_a9a = IsArray(&(field->value).type);
  }
  pcVar2 = "(";
  if (local_a9a != false) {
    pcVar2 = "VectorOf(";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_218,pcVar2,(allocator<char> *)(body.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(body.field_2._M_local_buf + 0xf));
  std::operator+(&local_280,"add",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
  std::operator+(&local_260,&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_var.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 &local_260,": ");
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::operator+(&local_2c0,"{{ACCESS_TYPE}} static func ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::operator+(&local_2a0,&local_2c0,"\\");
  CodeWriter::operator+=(&this->code_,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&is_enum.field_2 + 8),"{{STRUCTNAME}}.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::operator+(&local_300,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&is_enum.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_var.field_2 + 8));
  std::operator+(&local_2e0,&local_300,", &fbb)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(create_body,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)(is_enum.field_2._M_local_buf + 8));
  bVar1 = IsScalar((field->value).type.base_type);
  if ((!bVar1) || (bVar1 = IsBool((field->value).type.base_type), bVar1)) {
    bVar1 = IsBool((field->value).type.base_type);
    if (bVar1) {
      SwiftConstant_abi_cxx11_((string *)local_510,this,field);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"CONSTANT",&local_531)
      ;
      CodeWriter::SetValue(&this->code_,&local_530,(string *)local_510);
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator(&local_531);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"VALUETYPE",&local_559);
      bVar1 = FieldDef::IsOptional(field);
      pcVar2 = "Bool";
      if (bVar1) {
        pcVar2 = "Bool?";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,pcVar2,&local_581);
      CodeWriter::SetValue(&this->code_,&local_558,&local_580);
      std::__cxx11::string::~string((string *)&local_580);
      std::allocator<char>::~allocator(&local_581);
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator(&local_559);
      std::operator+(&local_5c8,"{{VALUETYPE}}",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_5a8,&local_5c8,"fbb.add(element: {{FIELDVAR}},\\");
      CodeWriter::operator+=(&this->code_,&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
      bVar1 = FieldDef::IsOptional(field);
      pcVar2 = " def: {{CONSTANT}},";
      if (bVar1) {
        pcVar2 = "\\";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,pcVar2,&local_5e9);
      CodeWriter::operator+=(&this->code_,&local_5e8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::allocator<char>::~allocator(&local_5e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610," at: {{TABLEOFFSET}}.{{OFFSET}}.p) }",&local_611);
      CodeWriter::operator+=(&this->code_,&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      std::allocator<char>::~allocator(&local_611);
      std::operator+(&local_698,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&type.field_2 + 8),": ");
      std::operator+(&local_678,&local_698,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::operator+(&local_658,&local_678," = ");
      bVar1 = FieldDef::IsOptional(field);
      create_struct._6_1_ = 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        create_struct._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"nil",(allocator<char> *)((long)&create_struct + 7));
      }
      else {
        std::__cxx11::string::string((string *)&local_6b8,(string *)local_510);
      }
      std::operator+(&local_638,&local_658,&local_6b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,&local_638);
      std::__cxx11::string::~string((string *)&local_638);
      std::__cxx11::string::~string((string *)&local_6b8);
      if ((create_struct._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&create_struct + 7));
      }
      std::__cxx11::string::~string((string *)&local_658);
      std::__cxx11::string::~string((string *)&local_678);
      std::__cxx11::string::~string((string *)&local_698);
      default_value_1.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_510);
    }
    else {
      bVar1 = IsStruct(&(field->value).type);
      if (bVar1) {
        local_6c8 = 
        "guard let {{FIELDVAR}} = {{FIELDVAR}} else { return }; fbb.create(struct: {{FIELDVAR}}, position: {{TABLEOFFSET}}.{{OFFSET}}.p) }"
        ;
        std::operator+(&local_728,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,"?");
        std::operator+(&local_708,&local_728,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::operator+(&local_6e8,&local_708,
                       "guard let {{FIELDVAR}} = {{FIELDVAR}} else { return }; fbb.create(struct: {{FIELDVAR}}, position: {{TABLEOFFSET}}.{{OFFSET}}.p) }"
                      );
        CodeWriter::operator+=(&this->code_,&local_6e8);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::__cxx11::string::~string((string *)&local_708);
        std::__cxx11::string::~string((string *)&local_728);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&arg_label.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&type.field_2 + 8),": ");
        std::operator+(&local_768,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&arg_label.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
        bVar1 = FieldDef::IsOptional(field);
        pcVar2 = "";
        if (bVar1) {
          pcVar2 = "? = nil";
        }
        std::operator+(&local_748,&local_768,pcVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,&local_748);
        std::__cxx11::string::~string((string *)&local_748);
        std::__cxx11::string::~string((string *)&local_768);
        std::__cxx11::string::~string((string *)(arg_label.field_2._M_local_buf + 8));
        default_value_1.field_2._8_4_ = 1;
      }
      else {
        IdlNamer::Variable_abi_cxx11_(&local_7c8,&this->namer_,field);
        bVar1 = IsVector(&(field->value).type);
        local_b6a = true;
        if (!bVar1) {
          local_b6a = IsArray(&(field->value).type);
        }
        pcVar2 = "Offset";
        if (local_b6a != false) {
          pcVar2 = "VectorOffset";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7a8,&local_7c8,pcVar2);
        std::__cxx11::string::~string((string *)&local_7c8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &reader_type,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7a8," ");
        std::operator+(&local_848,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &reader_type,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&type.field_2 + 8));
        std::operator+(&local_828,&local_848,": ");
        std::operator+(&local_808,&local_828,"Offset");
        bVar1 = FieldDef::IsRequired(field);
        pcVar2 = " = Offset()";
        if (bVar1) {
          pcVar2 = "";
        }
        std::operator+(&local_7e8,&local_808,pcVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,&local_7e8);
        std::__cxx11::string::~string((string *)&local_7e8);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&local_828);
        std::__cxx11::string::~string((string *)&local_848);
        std::__cxx11::string::~string((string *)&reader_type);
        bVar1 = IsStruct(&(field->value).type);
        local_b79 = 0;
        if (bVar1) {
          local_b79 = ((field->value).type.struct_def)->fixed;
        }
        local_870 = "offset: {{FIELDVAR}}, at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
        if ((local_b79 & 1) != 0) {
          local_870 = "structOffset: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vectortype.fixed_length,"Offset",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
        std::operator+(&local_8b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vectortype.fixed_length,"fbb.add(");
        std::operator+(&local_890,&local_8b0,local_870);
        CodeWriter::operator+=(&this->code_,&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        std::__cxx11::string::~string((string *)&local_8b0);
        std::__cxx11::string::~string((string *)&vectortype.fixed_length);
        Type::VectorType((Type *)((long)&field_name.field_2 + 8),&(field->value).type);
        if (((field_name.field_2._8_4_ == 0xf) &&
            ((((field->value).type.struct_def)->fixed & 1U) != 0)) &&
           ((bVar1 = IsVector(&(field->value).type), bVar1 ||
            (bVar1 = IsArray(&(field->value).type), bVar1)))) {
          IdlNamer::NamespacedType_abi_cxx11_
                    ((string *)local_910,&this->namer_,(Definition *)vectortype._0_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_990,"start_vector_of",&local_991);
          Namer::Method(&local_970,&(this->namer_).super_Namer,&local_990,
                        (string *)((long)&type.field_2 + 8));
          std::operator+(&local_950,"{{ACCESS_TYPE}} static func ",&local_970);
          std::operator+(&local_930,&local_950,
                         "(_ size: Int, in builder: inout FlatBufferBuilder) {");
          CodeWriter::operator+=(&this->code_,&local_930);
          std::__cxx11::string::~string((string *)&local_930);
          std::__cxx11::string::~string((string *)&local_950);
          std::__cxx11::string::~string((string *)&local_970);
          std::__cxx11::string::~string((string *)&local_990);
          std::allocator<char>::~allocator(&local_991);
          Indent(this);
          std::operator+(&local_a18,"builder.startVector(size * MemoryLayout<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_910);
          std::operator+(&local_9f8,&local_a18,">.size, elementSize: MemoryLayout<");
          std::operator+(&local_9d8,&local_9f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_910);
          std::operator+(&local_9b8,&local_9d8,">.alignment)");
          CodeWriter::operator+=(&this->code_,&local_9b8);
          std::__cxx11::string::~string((string *)&local_9b8);
          std::__cxx11::string::~string((string *)&local_9d8);
          std::__cxx11::string::~string((string *)&local_9f8);
          std::__cxx11::string::~string((string *)&local_a18);
          Outdent(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"}",&local_a39);
          CodeWriter::operator+=(&this->code_,&local_a38);
          std::__cxx11::string::~string((string *)&local_a38);
          std::allocator<char>::~allocator(&local_a39);
          std::__cxx11::string::~string((string *)local_910);
        }
        std::__cxx11::string::~string((string *)local_7a8);
        default_value_1.field_2._8_4_ = 0;
      }
    }
  }
  else {
    bVar1 = IsEnum(&(field->value).type);
    pcVar2 = "";
    if (bVar1) {
      pcVar2 = ".rawValue";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_340,pcVar2,
               (allocator<char> *)(optional_enum.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(optional_enum.field_2._M_local_buf + 0xf));
    local_36a = 0;
    bVar1 = IsEnum(&(field->value).type);
    if (bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     "?",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340);
    }
    else {
      std::allocator<char>::allocator();
      local_36a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_368,"",&local_369);
    }
    if ((local_36a & 1) != 0) {
      std::allocator<char>::~allocator(&local_369);
    }
    std::operator+(&local_3b0,"{{VALUETYPE}}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(&local_390,&local_3b0,"fbb.add(element: {{FIELDVAR}}\\");
    CodeWriter::operator+=(&this->code_,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    bVar1 = FieldDef::IsOptional(field);
    local_3d1 = 0;
    local_3d2 = 0;
    if (bVar1) {
      std::operator+(&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                     "\\");
      local_3d1 = 1;
    }
    else {
      std::operator+(&local_3d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                     ", def: {{CONSTANT}}\\");
      local_3d2 = 1;
    }
    CodeWriter::operator+=(&this->code_,&local_3d0);
    if ((local_3d2 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3d0);
    }
    if ((local_3d1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3d0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }",
               (allocator<char> *)(default_value.field_2._M_local_buf + 0xf));
    CodeWriter::operator+=(&this->code_,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)(default_value.field_2._M_local_buf + 0xf));
    local_422 = 0;
    bVar1 = IsEnum(&(field->value).type);
    if (bVar1) {
      bVar1 = FieldDef::IsOptional(field);
      if (bVar1) {
        std::allocator<char>::allocator();
        local_422 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_420,"nil",&local_421);
      }
      else {
        GenEnumDefaultValue_abi_cxx11_((string *)local_420,this,field);
      }
    }
    else {
      SwiftConstant_abi_cxx11_((string *)local_420,this,field);
    }
    if ((local_422 & 1) != 0) {
      std::allocator<char>::~allocator(&local_421);
    }
    std::operator+(&local_4c8,"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_var.field_2 + 8));
    std::operator+(&local_4a8,&local_4c8,": ");
    std::operator+(&local_488,&local_4a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::operator+(&local_468,&local_488," = ");
    bVar1 = FieldDef::IsOptional(field);
    default_value_1.field_2._M_local_buf[0xe] = '\0';
    if (bVar1) {
      std::allocator<char>::allocator();
      default_value_1.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"nil",
                 (allocator<char> *)(default_value_1.field_2._M_local_buf + 0xf));
    }
    else {
      std::__cxx11::string::string((string *)&local_4e8,(string *)local_420);
    }
    std::operator+(&local_448,&local_468,&local_4e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_4e8);
    if ((default_value_1.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)(default_value_1.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    default_value_1.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_420);
    std::__cxx11::string::~string((string *)local_368);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(field_var.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GenTableWriterFields(const FieldDef &field,
                            std::vector<std::string> *create_body,
                            std::vector<std::string> *create_header) {
    std::string builder_string = ", _ fbb: inout FlatBufferBuilder) { ";
    auto &create_func_body = *create_body;
    auto &create_func_header = *create_header;
    const auto field_field = namer_.Field(field);
    const auto field_var = namer_.Variable(field);
    const auto type = GenType(field.value.type);
    const auto opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    const auto nullable_type = opt_scalar ? type + "?" : type;
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("VALUETYPE", nullable_type);
    code_.SetValue("OFFSET", namer_.Field(field));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    std::string check_if_vector =
        (IsVector(field.value.type) || IsArray(field.value.type)) ? "VectorOf("
                                                                  : "(";
    const auto body = "add" + check_if_vector + field_field + ": ";
    code_ += "{{ACCESS_TYPE}} static func " + body + "\\";

    create_func_body.push_back("{{STRUCTNAME}}." + body + field_field +
                               ", &fbb)");

    if (IsScalar(field.value.type.base_type) &&
        !IsBool(field.value.type.base_type)) {
      const std::string is_enum = IsEnum(field.value.type) ? ".rawValue" : "";
      const std::string optional_enum =
          IsEnum(field.value.type) ? ("?" + is_enum) : "";
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}}\\";

      code_ += field.IsOptional() ? (optional_enum + "\\")
                                  : (is_enum + ", def: {{CONSTANT}}\\");

      code_ += ", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";

      const auto default_value =
          IsEnum(field.value.type)
              ? (field.IsOptional() ? "nil" : GenEnumDefaultValue(field))
              : SwiftConstant(field);
      create_func_header.push_back(
          "" + field_field + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value = SwiftConstant(field);

      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", field.IsOptional() ? "Bool?" : "Bool");
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}},\\";
      code_ += field.IsOptional() ? "\\" : " def: {{CONSTANT}},";
      code_ += " at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
      create_func_header.push_back(
          field_var + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsStruct(field.value.type)) {
      const auto create_struct =
          "guard let {{FIELDVAR}} = {{FIELDVAR}} else { return };"
          " fbb.create(struct: {{FIELDVAR}}, position: "
          "{{TABLEOFFSET}}.{{OFFSET}}.p) }";
      code_ += type + "?" + builder_string + create_struct;
      /// Optional hard coded since structs are always optional
      create_func_header.push_back(field_var + ": " + type +
                                   (field.IsOptional() ? "? = nil" : ""));
      return;
    }

    const auto arg_label =
        namer_.Variable(field) +
        (IsVector(field.value.type) || IsArray(field.value.type)
             ? "VectorOffset"
             : "Offset");
    create_func_header.push_back(arg_label + " " + field_var + ": " + "Offset" +
                                 (field.IsRequired() ? "" : " = Offset()"));
    const auto reader_type =
        IsStruct(field.value.type) && field.value.type.struct_def->fixed
            ? "structOffset: {{TABLEOFFSET}}.{{OFFSET}}.p) }"
            : "offset: {{FIELDVAR}}, at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
    code_ += "Offset" + builder_string + "fbb.add(" + reader_type;

    const auto vectortype = field.value.type.VectorType();

    if ((vectortype.base_type == BASE_TYPE_STRUCT &&
         field.value.type.struct_def->fixed) &&
        (IsVector(field.value.type) || IsArray(field.value.type))) {
      const auto field_name = namer_.NamespacedType(*vectortype.struct_def);
      code_ += "{{ACCESS_TYPE}} static func " +
               namer_.Method("start_vector_of", field_var) +
               "(_ size: Int, in builder: inout "
               "FlatBufferBuilder) {";
      Indent();
      code_ += "builder.startVector(size * MemoryLayout<" + field_name +
               ">.size, elementSize: MemoryLayout<" + field_name +
               ">.alignment)";
      Outdent();
      code_ += "}";
    }
  }